

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void codeApplyAffinity(Parse *pParse,int base,int n,char *zAff)

{
  int iVar1;
  Vdbe *p;
  bool bVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint p2;
  char *pcVar7;
  
  if (zAff != (char *)0x0) {
    if (0 < n) {
      pcVar7 = zAff + (uint)n;
      iVar1 = n + base;
      do {
        if (*zAff != 'b') goto LAB_0016c556;
        base = base + 1;
        zAff = zAff + 1;
        bVar2 = 1 < n;
        n = n - 1;
      } while (bVar2);
      n = 0;
      zAff = pcVar7;
      base = iVar1;
    }
LAB_0016c556:
    p = pParse->pVdbe;
    uVar5 = (ulong)(uint)n;
    uVar4 = 1;
    if (n < 1) {
      uVar4 = n;
    }
    uVar6 = n + 1;
    do {
      p2 = uVar4;
      if ((int)uVar5 < 2) break;
      uVar6 = uVar6 - 1;
      lVar3 = uVar5 - 1;
      uVar5 = uVar5 - 1;
      p2 = uVar6;
    } while (zAff[lVar3] == 'b');
    if (0 < (int)p2) {
      sqlite3VdbeAddOp3(p,0x1e,base,p2,0);
      sqlite3VdbeChangeP4(p,-1,zAff,p2);
      sqlite3ExprCacheRemove(pParse,base,p2);
      return;
    }
  }
  return;
}

Assistant:

static void codeApplyAffinity(Parse *pParse, int base, int n, char *zAff){
  Vdbe *v = pParse->pVdbe;
  if( zAff==0 ){
    assert( pParse->db->mallocFailed );
    return;
  }
  assert( v!=0 );

  /* Adjust base and n to skip over SQLITE_AFF_NONE entries at the beginning
  ** and end of the affinity string.
  */
  while( n>0 && zAff[0]==SQLITE_AFF_NONE ){
    n--;
    base++;
    zAff++;
  }
  while( n>1 && zAff[n-1]==SQLITE_AFF_NONE ){
    n--;
  }

  /* Code the OP_Affinity opcode if there is anything left to do. */
  if( n>0 ){
    sqlite3VdbeAddOp2(v, OP_Affinity, base, n);
    sqlite3VdbeChangeP4(v, -1, zAff, n);
    sqlite3ExprCacheAffinityChange(pParse, base, n);
  }
}